

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O3

int cmcmd_cmake_ninja_dyndep(const_iterator argBeg,const_iterator argEnd)

{
  _Alloc_hider m2;
  bool bVar1;
  int iVar2;
  Value *pVVar3;
  Value *this;
  cmGlobalNinjaGenerator *this_00;
  uint uVar4;
  char *pcVar5;
  string *this_01;
  pointer __x;
  const_iterator cVar6;
  string dir_cur_src;
  string arg_tdi;
  string arg_dd;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linked_target_dirs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arg_ddis;
  undefined1 local_4b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4a8;
  Value tdio;
  string module_dir;
  string dir_top_src;
  string dir_top_bld;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arg_full;
  string dir_cur_bld;
  deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_> local_3a8;
  _Alloc_hider local_358;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_348 [3];
  _Alloc_hider local_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_300;
  cmake cm;
  
  cmSystemTools::HandleResponseFile(&arg_full,argBeg,argEnd);
  arg_dd._M_dataplus._M_p = (pointer)&arg_dd.field_2;
  arg_dd._M_string_length = 0;
  arg_dd.field_2._M_local_buf[0] = '\0';
  arg_tdi._M_dataplus._M_p = (pointer)&arg_tdi.field_2;
  arg_tdi._M_string_length = 0;
  arg_tdi.field_2._M_local_buf[0] = '\0';
  arg_ddis.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  arg_ddis.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  arg_ddis.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pcVar5 = "-E cmake_ninja_dyndep requires value for --tdi=";
  if (arg_full.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      arg_full.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __x = arg_full.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    do {
      pcVar5 = (__x->_M_dataplus)._M_p;
      iVar2 = strncmp(pcVar5,"--tdi=",6);
      if (iVar2 == 0) {
        std::__cxx11::string::substr((ulong)&cm,(ulong)__x);
        this_01 = &arg_tdi;
LAB_00388dc7:
        std::__cxx11::string::operator=((string *)this_01,(string *)&cm);
        if (cm.Generators.
            super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pointer)&cm.Generators.
                      super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete(cm.Generators.
                          super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)cm.Generators.
                                super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
        }
      }
      else {
        iVar2 = strncmp(pcVar5,"--dd=",5);
        if (iVar2 == 0) {
          std::__cxx11::string::substr((ulong)&cm,(ulong)__x);
          this_01 = &arg_dd;
          goto LAB_00388dc7;
        }
        if (((*pcVar5 == '-') && (pcVar5[1] == '-')) || (__x->_M_string_length < 4)) {
LAB_0038908c:
          uVar4 = 1;
          cmSystemTools::Error
                    ("-E cmake_ninja_dyndep unknown argument: ",pcVar5,(char *)0x0,(char *)0x0);
          goto LAB_003890bd;
        }
        iVar2 = strcmp(pcVar5 + (__x->_M_string_length - 4),".ddi");
        if (iVar2 != 0) goto LAB_0038908c;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&arg_ddis,__x);
      }
      __x = __x + 1;
    } while (__x != arg_full.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
    pcVar5 = "-E cmake_ninja_dyndep requires value for --tdi=";
    if (arg_tdi._M_string_length != 0) {
      if (arg_dd._M_string_length != 0) {
        Json::Value::Value(&tdio,nullValue);
        std::ifstream::ifstream(&cm,arg_tdi._M_dataplus._M_p,_S_in|_S_bin);
        Json::Reader::Reader((Reader *)&dir_cur_bld);
        bVar1 = Json::Reader::parse((Reader *)&dir_cur_bld,(istream *)&cm,&tdio,false);
        m2 = arg_tdi._M_dataplus;
        if (bVar1) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310._M_p != &local_300) {
            operator_delete(local_310._M_p,local_300._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_358._M_p != local_348) {
            operator_delete(local_358._M_p,local_348[0]._M_allocated_capacity + 1);
          }
          std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
                    (&local_3a8);
          std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
                    ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)&dir_cur_bld);
          std::ifstream::~ifstream(&cm);
          pVVar3 = Json::Value::operator[](&tdio,"dir-cur-bld");
          Json::Value::asString_abi_cxx11_(&dir_cur_bld,pVVar3);
          pVVar3 = Json::Value::operator[](&tdio,"dir-cur-src");
          Json::Value::asString_abi_cxx11_(&dir_cur_src,pVVar3);
          pVVar3 = Json::Value::operator[](&tdio,"dir-top-bld");
          Json::Value::asString_abi_cxx11_(&dir_top_bld,pVVar3);
          pVVar3 = Json::Value::operator[](&tdio,"dir-top-src");
          Json::Value::asString_abi_cxx11_(&dir_top_src,pVVar3);
          pVVar3 = Json::Value::operator[](&tdio,"module-dir");
          Json::Value::asString_abi_cxx11_(&module_dir,pVVar3);
          if (module_dir._M_string_length != 0) {
            std::__cxx11::string::append((char *)&module_dir);
          }
          linked_target_dirs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          linked_target_dirs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          linked_target_dirs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pVVar3 = Json::Value::operator[](&tdio,"linked-target-dirs");
          bVar1 = Json::Value::isArray(pVVar3);
          if (bVar1) {
            cVar6 = Json::Value::begin(pVVar3);
            local_4b8._0_8_ = cVar6.super_ValueIteratorBase.current_._M_node;
            local_4b8[8] = cVar6.super_ValueIteratorBase.isNull_;
            while( true ) {
              cVar6 = Json::Value::end(pVVar3);
              cm.Generators.
              super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)cVar6.super_ValueIteratorBase.current_._M_node;
              cm.Generators.
              super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
              ._M_impl.super__Vector_impl_data._M_finish._0_1_ =
                   cVar6.super_ValueIteratorBase.isNull_;
              bVar1 = Json::ValueIteratorBase::isEqual
                                ((ValueIteratorBase *)local_4b8,(SelfType *)&cm);
              if (bVar1) break;
              this = Json::ValueIteratorBase::deref((ValueIteratorBase *)local_4b8);
              Json::Value::asString_abi_cxx11_((string *)&cm,this);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &linked_target_dirs,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cm);
              if (cm.Generators.
                  super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  (pointer)&cm.Generators.
                            super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                operator_delete(cm.Generators.
                                super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)cm.Generators.
                                      super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
              }
              Json::ValueIteratorBase::increment((ValueIteratorBase *)local_4b8);
            }
          }
          cmake::cmake(&cm,RoleInternal);
          cmake::SetHomeDirectory(&cm,&dir_top_src);
          cmake::SetHomeOutputDirectory(&cm,&dir_top_bld);
          local_4b8._0_8_ = &local_4a8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_4b8,"Ninja","");
          this_00 = (cmGlobalNinjaGenerator *)cmake::CreateGlobalGenerator(&cm,(string *)local_4b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4b8._0_8_ != &local_4a8) {
            operator_delete((void *)local_4b8._0_8_,local_4a8._M_allocated_capacity + 1);
          }
          if (this_00 == (cmGlobalNinjaGenerator *)0x0) {
            uVar4 = 1;
          }
          else {
            bVar1 = cmGlobalNinjaGenerator::WriteDyndepFile
                              (this_00,&dir_top_src,&dir_top_bld,&dir_cur_src,&dir_cur_bld,&arg_dd,
                               &arg_ddis,&module_dir,&linked_target_dirs);
            uVar4 = (uint)!bVar1;
            (*(this_00->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
              _vptr_cmGlobalGenerator[1])(this_00);
          }
          cmake::~cmake(&cm);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&linked_target_dirs);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)module_dir._M_dataplus._M_p != &module_dir.field_2) {
            operator_delete(module_dir._M_dataplus._M_p,module_dir.field_2._M_allocated_capacity + 1
                           );
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)dir_top_src._M_dataplus._M_p != &dir_top_src.field_2) {
            operator_delete(dir_top_src._M_dataplus._M_p,
                            dir_top_src.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)dir_top_bld._M_dataplus._M_p != &dir_top_bld.field_2) {
            operator_delete(dir_top_bld._M_dataplus._M_p,
                            dir_top_bld.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)dir_cur_src._M_dataplus._M_p != &dir_cur_src.field_2) {
            operator_delete(dir_cur_src._M_dataplus._M_p,
                            dir_cur_src.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)dir_cur_bld._M_dataplus._M_p != &dir_cur_bld.field_2) {
            operator_delete(dir_cur_bld._M_dataplus._M_p,
                            dir_cur_bld.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          Json::Reader::getFormattedErrorMessages_abi_cxx11_(&dir_cur_src,(Reader *)&dir_cur_bld);
          cmSystemTools::Error
                    ("-E cmake_ninja_dyndep failed to parse ",m2._M_p,dir_cur_src._M_dataplus._M_p,
                     (char *)0x0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)dir_cur_src._M_dataplus._M_p != &dir_cur_src.field_2) {
            operator_delete(dir_cur_src._M_dataplus._M_p,
                            dir_cur_src.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310._M_p != &local_300) {
            operator_delete(local_310._M_p,local_300._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_358._M_p != local_348) {
            operator_delete(local_358._M_p,local_348[0]._M_allocated_capacity + 1);
          }
          std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
                    (&local_3a8);
          std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
                    ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)&dir_cur_bld);
          std::ifstream::~ifstream(&cm);
          uVar4 = 1;
        }
        Json::Value::~Value(&tdio);
        goto LAB_003890bd;
      }
      pcVar5 = "-E cmake_ninja_dyndep requires value for --dd=";
    }
  }
  uVar4 = 1;
  cmSystemTools::Error(pcVar5,(char *)0x0,(char *)0x0,(char *)0x0);
LAB_003890bd:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&arg_ddis);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)arg_tdi._M_dataplus._M_p != &arg_tdi.field_2) {
    operator_delete(arg_tdi._M_dataplus._M_p,
                    CONCAT71(arg_tdi.field_2._M_allocated_capacity._1_7_,
                             arg_tdi.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)arg_dd._M_dataplus._M_p != &arg_dd.field_2) {
    operator_delete(arg_dd._M_dataplus._M_p,
                    CONCAT71(arg_dd.field_2._M_allocated_capacity._1_7_,
                             arg_dd.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&arg_full);
  return uVar4;
}

Assistant:

int cmcmd_cmake_ninja_dyndep(std::vector<std::string>::const_iterator argBeg,
                             std::vector<std::string>::const_iterator argEnd)
{
  std::vector<std::string> arg_full =
    cmSystemTools::HandleResponseFile(argBeg, argEnd);

  std::string arg_dd;
  std::string arg_tdi;
  std::vector<std::string> arg_ddis;
  for (std::vector<std::string>::const_iterator a = arg_full.begin();
       a != arg_full.end(); ++a) {
    std::string const& arg = *a;
    if (cmHasLiteralPrefix(arg, "--tdi=")) {
      arg_tdi = arg.substr(6);
    } else if (cmHasLiteralPrefix(arg, "--dd=")) {
      arg_dd = arg.substr(5);
    } else if (!cmHasLiteralPrefix(arg, "--") &&
               cmHasLiteralSuffix(arg, ".ddi")) {
      arg_ddis.push_back(arg);
    } else {
      cmSystemTools::Error("-E cmake_ninja_dyndep unknown argument: ",
                           arg.c_str());
      return 1;
    }
  }
  if (arg_tdi.empty()) {
    cmSystemTools::Error("-E cmake_ninja_dyndep requires value for --tdi=");
    return 1;
  }
  if (arg_dd.empty()) {
    cmSystemTools::Error("-E cmake_ninja_dyndep requires value for --dd=");
    return 1;
  }

  Json::Value tdio;
  Json::Value const& tdi = tdio;
  {
    cmsys::ifstream tdif(arg_tdi.c_str(), std::ios::in | std::ios::binary);
    Json::Reader reader;
    if (!reader.parse(tdif, tdio, false)) {
      cmSystemTools::Error("-E cmake_ninja_dyndep failed to parse ",
                           arg_tdi.c_str(),
                           reader.getFormattedErrorMessages().c_str());
      return 1;
    }
  }

  std::string const dir_cur_bld = tdi["dir-cur-bld"].asString();
  std::string const dir_cur_src = tdi["dir-cur-src"].asString();
  std::string const dir_top_bld = tdi["dir-top-bld"].asString();
  std::string const dir_top_src = tdi["dir-top-src"].asString();
  std::string module_dir = tdi["module-dir"].asString();
  if (!module_dir.empty()) {
    module_dir += "/";
  }
  std::vector<std::string> linked_target_dirs;
  Json::Value const& tdi_linked_target_dirs = tdi["linked-target-dirs"];
  if (tdi_linked_target_dirs.isArray()) {
    for (Json::Value::const_iterator i = tdi_linked_target_dirs.begin();
         i != tdi_linked_target_dirs.end(); ++i) {
      linked_target_dirs.push_back(i->asString());
    }
  }

  cmake cm(cmake::RoleInternal);
  cm.SetHomeDirectory(dir_top_src);
  cm.SetHomeOutputDirectory(dir_top_bld);
  CM_AUTO_PTR<cmGlobalNinjaGenerator> ggd(
    static_cast<cmGlobalNinjaGenerator*>(cm.CreateGlobalGenerator("Ninja")));
  if (!ggd.get() ||
      !ggd->WriteDyndepFile(dir_top_src, dir_top_bld, dir_cur_src, dir_cur_bld,
                            arg_dd, arg_ddis, module_dir,
                            linked_target_dirs)) {
    return 1;
  }
  return 0;
}